

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-mod-info.cc
# Opt level: O3

int main(int argc,char **argv)

{
  element_type *peVar1;
  char *pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined8 uVar4;
  size_type sVar5;
  char **ppcVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  ostream *poVar11;
  undefined4 extraout_var;
  mapped_type *pmVar12;
  _Base_ptr p_Var13;
  long *plVar14;
  undefined8 *puVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **pp_Var16;
  char **ppcVar17;
  bool bVar18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var19;
  int iVar20;
  char **ppcVar21;
  QPDFWriter w;
  QPDF file;
  QPDFObjectHandle filetrailer;
  string fl_tmp;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  Keys;
  QPDFObjectHandle local_158;
  long local_148;
  undefined8 uStack_140;
  QPDF local_138 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  char **local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  long lStack_108;
  int local_fc;
  undefined1 local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  key_type local_b8;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88 [3];
  char **local_70;
  undefined8 local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  pcVar10 = (char *)QUtil::getWhoami(*argv);
  whoami = pcVar10;
  if (argc == 3) {
    iVar8 = strcmp(argv[1],"--dump");
    if (iVar8 != 0) goto LAB_00103b9e;
  }
  else {
    if (argc == 2) {
      iVar8 = strcmp(argv[1],"--version");
      if (iVar8 == 0) {
        poVar11 = std::operator<<((ostream *)&std::cout,pcVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," version ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"1.1",3);
        std::endl<char,std::char_traits<char>>(poVar11);
        goto LAB_0010430c;
      }
LAB_00103b9e:
      local_130 = &local_b8.field_2;
      local_b8.field_2._M_local_buf[0] = '\0';
      local_b8._M_string_length = 0;
      iVar8 = 1;
      local_68 = 0;
      local_128 = (char **)0x0;
      local_70 = (char **)0x0;
      local_fc = argc;
      local_b8._M_dataplus._M_p = (pointer)local_130;
      do {
        ppcVar21 = (char **)argv[iVar8];
        iVar9 = strcmp((char *)ppcVar21,"--in");
        iVar20 = iVar8;
        if (iVar9 == 0) {
          iVar20 = iVar8 + 1;
          ppcVar21 = (char **)argv[(long)iVar8 + 1];
          ppcVar17 = local_128;
          ppcVar6 = ppcVar21;
          if (argc <= iVar20) goto LAB_00103c01;
        }
        else {
LAB_00103c01:
          iVar8 = strcmp((char *)ppcVar21,"--out");
          if (iVar8 == 0) {
            iVar8 = iVar20 + 1;
            ppcVar21 = (char **)argv[(long)iVar20 + 1];
            iVar20 = iVar8;
            ppcVar17 = ppcVar21;
            ppcVar6 = local_70;
            if (iVar8 < argc) goto LAB_00103ddc;
          }
          iVar8 = strcmp((char *)ppcVar21,"--static-id");
          if (iVar8 == 0) {
            local_68 = CONCAT71((int7)(CONCAT44(extraout_var,iVar8) >> 8),1);
            ppcVar17 = local_128;
            ppcVar6 = local_70;
          }
          else {
            iVar8 = strcmp((char *)ppcVar21,"--key");
            sVar5 = local_b8._M_string_length;
            if (iVar8 == 0) {
              iVar8 = iVar20 + 1;
              ppcVar21 = (char **)argv[(long)iVar20 + 1];
              iVar20 = iVar8;
              if (iVar8 < argc) {
                strlen((char *)ppcVar21);
                std::__cxx11::string::_M_replace((ulong)&local_b8,0,(char *)sVar5,(ulong)ppcVar21);
                if (((char *)local_b8._M_string_length == (char *)0x0) ||
                   (*local_b8._M_dataplus._M_p != '/')) {
                  std::operator+(&local_d8,"/",&local_b8);
                  std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_d8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                    operator_delete(local_d8._M_dataplus._M_p,
                                    local_d8.field_2._M_allocated_capacity + 1);
                  }
                }
                pmVar12 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)&local_60,&local_b8);
                std::__cxx11::string::_M_replace
                          ((ulong)pmVar12,0,(char *)pmVar12->_M_string_length,0x105105);
                ppcVar17 = local_128;
                ppcVar6 = local_70;
                goto LAB_00103ddc;
              }
            }
            iVar8 = strcmp((char *)ppcVar21,"--val");
            if (((iVar8 != 0) || (iVar20 = iVar20 + 1, argc <= iVar20)) ||
               ((char *)local_b8._M_string_length == (char *)0x0)) {
              usage();
              goto LAB_001042f9;
            }
            pcVar10 = argv[iVar20];
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&local_60,&local_b8);
            pcVar2 = (char *)pmVar12->_M_string_length;
            strlen(pcVar10);
            argc = local_fc;
            std::__cxx11::string::_M_replace((ulong)pmVar12,0,pcVar2,(ulong)pcVar10);
            local_b8._M_string_length = 0;
            *local_b8._M_dataplus._M_p = '\0';
            ppcVar17 = local_128;
            ppcVar6 = local_70;
          }
        }
LAB_00103ddc:
        local_70 = ppcVar6;
        local_128 = ppcVar17;
        ppcVar21 = local_70;
        iVar8 = iVar20 + 1;
      } while (iVar8 < argc);
      argv = local_70;
      if (local_70 == (char **)0x0) goto LAB_001042f9;
      ppcVar17 = local_128;
      if (local_128 == (char **)0x0) {
        ppcVar17 = local_70;
      }
      if (local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,(char *)ppcVar17,(allocator<char> *)&local_158);
        std::__cxx11::string::append((char *)&local_d8);
        QPDF::QPDF(local_138);
        QPDF::processFile((char *)local_138,(char *)ppcVar21);
        local_128 = ppcVar17;
        QPDF::getTrailer();
        local_f8._0_8_ = (element_type *)0x0;
        local_f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        bVar18 = SUB81(&local_158,0);
        if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
            &local_60._M_impl.super__Rb_tree_header) {
          p_Var13 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            if ((element_type *)local_f8._0_8_ == (element_type *)0x0) {
              local_158.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)&local_148;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"/Info","");
              cVar7 = QPDFObjectHandle::hasKey((string *)&local_120);
              if (local_158.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)&local_148) {
                operator_delete(local_158.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                                local_148 + 1);
              }
              if (cVar7 == '\0') {
                QPDFObjectHandle::newDictionary();
                uVar4 = local_f8._8_8_;
                local_f8._8_8_ =
                     local_158.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
                local_f8._0_8_ =
                     local_158.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                local_158.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                local_158.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4),
                   local_158.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_158.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi);
                }
                local_158.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)&local_148;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"/Info","");
                QPDFObjectHandle::replaceKey((string *)&local_120,&local_158);
              }
              else {
                local_158.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)&local_148;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"/Info","");
                QPDFObjectHandle::getKey((string *)&local_98);
                p_Var19 = p_Stack_90;
                local_f8._0_8_ = local_98;
                uVar4 = local_f8._8_8_;
                local_98 = (element_type *)0x0;
                p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_f8._8_8_ = p_Var19;
                if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4),
                   p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                }
              }
              if (local_158.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)&local_148) {
                operator_delete(local_158.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                                local_148 + 1);
              }
            }
            iVar8 = std::__cxx11::string::compare((char *)(p_Var13 + 2));
            if (iVar8 == 0) {
              QPDFObjectHandle::removeKey((string *)local_f8);
            }
            else {
              QPDFObjectHandle::newString((string *)&local_158);
              QPDFObjectHandle::makeDirect(bVar18);
              QPDFObjectHandle::replaceKey((string *)local_f8,(QPDFObjectHandle *)(p_Var13 + 1));
              if (local_158.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_158.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
              }
            }
            p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
          } while ((_Rb_tree_header *)p_Var13 != &local_60._M_impl.super__Rb_tree_header);
        }
        QPDFWriter::QPDFWriter((QPDFWriter *)&local_158,local_138,local_d8._M_dataplus._M_p);
        QPDFWriter::setStreamDataMode((qpdf_stream_data_e)&local_158);
        ppcVar21 = local_128;
        QPDFWriter::setLinearization(bVar18);
        QPDFWriter::setStaticID(bVar18);
        QPDFWriter::write();
        if (local_158.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_158.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
        }
        if (local_118 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118);
        }
        QPDF::~QPDF(local_138);
        remove((char *)ppcVar21);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                       ,"rename ",&local_d8);
        plVar14 = (long *)std::__cxx11::string::append(local_f8);
        pp_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(plVar14 + 2);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*plVar14 == pp_Var16) {
          local_110 = *pp_Var16;
          lStack_108 = plVar14[3];
          local_120 = &local_110;
        }
        else {
          local_110 = *pp_Var16;
          local_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*plVar14;
        }
        local_118 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar14[1];
        *plVar14 = (long)pp_Var16;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,(char *)ppcVar21,(allocator<char> *)local_138);
        p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
        if (local_120 != &local_110) {
          p_Var19 = local_110;
        }
        if (p_Var19 < p_Stack_90 + (long)local_118) {
          p_Var19 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
          if (local_98 != (element_type *)local_88) {
            p_Var19 = local_88[0];
          }
          if (p_Stack_90 + (long)local_118 <= p_Var19) {
            puVar15 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_120)
            ;
            goto LAB_001041be;
          }
        }
        puVar15 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_98);
LAB_001041be:
        local_158.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)&local_148;
        peVar1 = (element_type *)(puVar15 + 2);
        if ((element_type *)*puVar15 == peVar1) {
          local_148 = *(long *)peVar1;
          uStack_140 = puVar15[3];
        }
        else {
          local_148 = *(long *)peVar1;
          local_158.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)*puVar15;
        }
        local_158.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar15[1];
        *puVar15 = peVar1;
        puVar15[1] = 0;
        *peVar1 = (element_type)0x0;
        iVar8 = rename(local_d8._M_dataplus._M_p,(char *)ppcVar21);
        QUtil::os_wrapper((string *)&local_158,iVar8);
        if (local_158.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)&local_148) {
          operator_delete(local_158.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          local_148 + 1);
        }
        if (local_98 != (element_type *)local_88) {
          operator_delete(local_98,(ulong)(local_88[0] + 1));
        }
        if (local_120 != &local_110) {
          operator_delete(local_120,(ulong)(local_110 + 1));
        }
        paVar3 = local_130;
        if ((element_type *)local_f8._0_8_ != (element_type *)(local_f8 + 0x10)) {
          operator_delete((void *)local_f8._0_8_,local_e8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar3) {
          operator_delete(local_b8._M_dataplus._M_p,
                          CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                   local_b8.field_2._M_local_buf[0]) + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_60);
        return 0;
      }
    }
    else {
      local_130 = &local_b8.field_2;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_local_buf[0] = '\0';
      local_b8._M_dataplus._M_p = (pointer)local_130;
      if (1 < argc) goto LAB_00103b9e;
LAB_001042f9:
      usage();
    }
    usage();
  }
  pdfDumpInfoDict(argv[2]);
LAB_0010430c:
  exit(0);
}

Assistant:

int
main(int argc, char* argv[])
{
    bool static_id = false;
    std::map<std::string, std::string> Keys;

    whoami = QUtil::getWhoami(argv[0]);

    if ((argc == 2) && (!strcmp(argv[1], "--version"))) {
        std::cout << whoami << " version " << version << std::endl;
        exit(0);
    }
    if ((argc == 3) && (!strcmp(argv[1], "--dump"))) {
        QTC::TC("examples", "pdf-mod-info --dump");
        pdfDumpInfoDict(argv[2]);
        exit(0);
    }

    char* fl_in = nullptr;
    char* fl_out = nullptr;
    std::string cur_key;

    for (int i = 1; i < argc; ++i) {
        if ((!strcmp(argv[i], "--in")) && (++i < argc)) {
            fl_in = argv[i];
        } else if ((!strcmp(argv[i], "--out")) && (++i < argc)) {
            fl_out = argv[i];
        } else if (!strcmp(argv[i], "--static-id")) // don't document
        {
            static_id = true; // this should be used in test suites only
        } else if ((!strcmp(argv[i], "--key")) && (++i < argc)) {
            QTC::TC("examples", "pdf-mod-info -key");
            cur_key = argv[i];
            if (!((cur_key.length() > 0) && (cur_key.at(0) == '/'))) {
                cur_key = "/" + cur_key;
            }
            Keys[cur_key] = "";
        } else if ((!strcmp(argv[i], "--val")) && (++i < argc)) {
            if (cur_key.empty()) {
                QTC::TC("examples", "pdf-mod-info usage wrong val");
                usage();
            }
            QTC::TC("examples", "pdf-mod-info -val");
            Keys[cur_key] = argv[i];
            cur_key.clear();
        } else {
            QTC::TC("examples", "pdf-mod-info usage junk");
            usage();
        }
    }
    if (!fl_in) {
        QTC::TC("examples", "pdf-mod-info no in file");
        usage();
    }
    if (!fl_out) {
        QTC::TC("examples", "pdf-mod-info in-place");
        fl_out = fl_in;
    }
    if (Keys.size() == 0) {
        QTC::TC("examples", "pdf-mod-info no keys");
        usage();
    }

    std::string fl_tmp = fl_out;
    fl_tmp += ".tmp";

    try {
        QPDF file;
        file.processFile(fl_in);

        QPDFObjectHandle filetrailer = file.getTrailer();
        QPDFObjectHandle fileinfo;

        for (auto const& it: Keys) {
            if (!fileinfo) {
                if (filetrailer.hasKey("/Info")) {
                    QTC::TC("examples", "pdf-mod-info has info");
                    fileinfo = filetrailer.getKey("/Info");
                } else {
                    QTC::TC("examples", "pdf-mod-info file no info");
                    fileinfo = QPDFObjectHandle::newDictionary();
                    filetrailer.replaceKey("/Info", fileinfo);
                }
            }
            if (it.second == "") {
                fileinfo.removeKey(it.first);
            } else {
                QPDFObjectHandle elt = fileinfo.newString(it.second);
                elt.makeDirect();
                fileinfo.replaceKey(it.first, elt);
            }
        }
        QPDFWriter w(file, fl_tmp.c_str());
        w.setStreamDataMode(qpdf_s_preserve);
        w.setLinearization(true);
        w.setStaticID(static_id); // for testing only
        w.write();
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
        exit(2);
    }

    try {
        (void)remove(fl_out);
        QUtil::os_wrapper(
            "rename " + fl_tmp + " " + std::string(fl_out), rename(fl_tmp.c_str(), fl_out));
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
        exit(2);
    }

    return 0;
}